

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GGMTree.cpp
# Opt level: O2

void GGMTree::derive_key_from_tree
               (uint8_t *current_key,long offset,int start_level,int target_level)

{
  int k_bit;
  uint8_t next_key [16];
  
  if (start_level != target_level) {
    while (target_level < start_level) {
      start_level = start_level + -1;
      k_bit = (int)((1 << ((byte)start_level & 0x1f) & offset) >> ((byte)start_level & 0x3f));
      key_derivation((uchar *)&k_bit,4,current_key,0x10,next_key);
      *(undefined8 *)current_key = next_key._0_8_;
      *(undefined8 *)(current_key + 8) = next_key._8_8_;
    }
  }
  return;
}

Assistant:

void GGMTree::derive_key_from_tree(uint8_t *current_key, long offset, int start_level, int target_level) {
    uint8_t next_key[AES_BLOCK_SIZE];
    // does not need to derive
    if(start_level == target_level) return;
    // derive tag
    for (int k = start_level; k > target_level; --k) {
        int k_bit = (offset & (1 << (k - 1))) >> (k - 1);
        key_derivation((uint8_t*) &k_bit, sizeof(int),
                       current_key, AES_BLOCK_SIZE,
                       next_key);
        memcpy(current_key, next_key, AES_BLOCK_SIZE);
    }
}